

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_HasWif_compressed_Test::Privkey_HasWif_compressed_Test(Privkey_HasWif_compressed_Test *this)

{
  Privkey_HasWif_compressed_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Privkey_HasWif_compressed_Test_009e10d8;
  return;
}

Assistant:

TEST(Privkey, HasWif_compressed) {
  std::string wif = "cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg";
  NetType net_type = NetType::kRegtest;
  bool is_compressed = false;
  bool has_wif = Privkey::HasWif(wif, &net_type, &is_compressed);
  EXPECT_TRUE(has_wif);
  EXPECT_TRUE(is_compressed);
  EXPECT_EQ(NetType::kTestnet, net_type);
}